

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

bool __thiscall r_exec::PGMOverlay::check_guards(PGMOverlay *this)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  ushort local_1e;
  uint16_t i;
  uint16_t guard_count;
  uint16_t guard_set_index;
  PGMOverlay *this_local;
  
  sVar3 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  local_1e = 1;
  while( true ) {
    if (bVar1 < local_1e) {
      return true;
    }
    bVar2 = InputLessPGMOverlay::evaluate(&this->super_InputLessPGMOverlay,sVar3 + local_1e);
    if (!bVar2) break;
    local_1e = local_1e + 1;
  }
  return false;
}

Assistant:

bool PGMOverlay::check_guards()
{
    uint16_t guard_set_index = code[PGM_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) {
        if (!evaluate(guard_set_index + i)) {
            return false;
        }
    }

    return true;
}